

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int evalConstExpr(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  Parse *pParse;
  ExprList *pEVar3;
  int iVar4;
  ExprList_item *pEVar5;
  Expr *pEVar6;
  uint uVar7;
  Walker local_40;
  
  pParse = pWalker->pParse;
  bVar2 = pExpr->op;
  if (bVar2 < 0x97) {
    if (bVar2 == 0x48) {
      return 1;
    }
    if (bVar2 == 0x5c) {
      return 0;
    }
    if (bVar2 == 0x84) {
      return 1;
    }
  }
  else if ((((bVar2 == 0x97) || (bVar2 == 0x99)) || (bVar2 == 0x9b)) &&
          ((pEVar3 = (pExpr->x).pList, pEVar3 != (ExprList *)0x0 && (0 < pEVar3->nExpr)))) {
    pEVar5 = pEVar3->a;
    iVar4 = pEVar3->nExpr + 1;
    do {
      if (pEVar5->pExpr != (Expr *)0x0) {
        pbVar1 = (byte *)((long)&pEVar5->pExpr->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      pEVar5 = pEVar5 + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  local_40.pParse = (Parse *)0x0;
  local_40.walkerDepth = 0;
  local_40.bSelectDepthFirst = '\0';
  local_40._29_3_ = 0;
  local_40.u = (anon_union_8_4_3af73d92_for_u)0x3;
  local_40.xExprCallback = exprNodeIsConstant;
  local_40.xSelectCallback = selectNodeIsConstant;
  sqlite3WalkExpr(&local_40,pExpr);
  iVar4 = 0;
  if (local_40.u.i != 0) {
    pEVar6 = pExpr;
    if ((pExpr->flags & 0x200) != 0) {
      for (; pEVar6->op == 0x9d; pEVar6 = pEVar6->pLeft) {
      }
      uVar7 = pEVar6->op - 0x5e;
      if (uVar7 < 0x3f) {
        if ((0xb800000011U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
          return 0;
        }
        if (((ulong)uVar7 == 0x3e) && ((byte)(pEVar6->pLeft->op + 0x7f) < 2)) {
          return 0;
        }
      }
    }
    iVar4 = pParse->nMem + 1;
    pParse->nMem = iVar4;
    iVar4 = sqlite3ExprCodeTarget(pParse,pExpr,iVar4);
    pExpr->op2 = pExpr->op;
    pExpr->op = 0x84;
    pExpr->iTable = iVar4;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int evalConstExpr(Walker *pWalker, Expr *pExpr){
  Parse *pParse = pWalker->pParse;
  switch( pExpr->op ){
    case TK_IN:
    case TK_REGISTER: {
      return WRC_Prune;
    }
    case TK_COLLATE: {
      return WRC_Continue;
    }
    case TK_FUNCTION:
    case TK_AGG_FUNCTION:
    case TK_CONST_FUNC: {
      /* The arguments to a function have a fixed destination.
      ** Mark them this way to avoid generated unneeded OP_SCopy
      ** instructions. 
      */
      ExprList *pList = pExpr->x.pList;
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      if( pList ){
        int i = pList->nExpr;
        struct ExprList_item *pItem = pList->a;
        for(; i>0; i--, pItem++){
          if( ALWAYS(pItem->pExpr) ) pItem->pExpr->flags |= EP_FixedDest;
        }
      }
      break;
    }
  }
  if( isAppropriateForFactoring(pExpr) ){
    int r1 = ++pParse->nMem;
    int r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    /* If r2!=r1, it means that register r1 is never used.  That is harmless
    ** but suboptimal, so we want to know about the situation to fix it.
    ** Hence the following assert: */
    assert( r2==r1 );
    pExpr->op2 = pExpr->op;
    pExpr->op = TK_REGISTER;
    pExpr->iTable = r2;
    return WRC_Prune;
  }
  return WRC_Continue;
}